

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

Maybe<capnp::Orphan<capnp::DynamicValue>_> * __thiscall
capnp::compiler::ValueTranslator::compileValue
          (Maybe<capnp::Orphan<capnp::DynamicValue>_> *__return_storage_ptr__,ValueTranslator *this,
          Reader src,Type type)

{
  ErrorReporter *this_00;
  Type type_00;
  uint8_t uVar1;
  bool bVar2;
  ushort uVar3;
  ulong uVar4;
  uint64_t uVar5;
  EnumSchema EVar6;
  StructSchema SVar7;
  Which WVar8;
  anon_union_8_2_eba6ea51_for_Type_5 aVar9;
  ulong uVar10;
  char *pcVar11;
  char (*in_R8) [2];
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  ReaderFor<DynamicEnum> RVar12;
  Type type_local;
  Fault f;
  undefined1 local_108 [64];
  Orphan<capnp::DynamicValue> result;
  Schema local_90;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_88;
  RawBrandedSchema *local_50;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_48;
  Type local_40;
  
  aVar9 = type.field_4;
  uVar4 = type._0_8_;
  type_local.baseType = type.baseType;
  WVar8 = type_local.baseType;
  type_local.listDepth = type.listDepth;
  uVar1 = type_local.listDepth;
  type_local._3_5_ = type._3_5_;
  type_local.field_4.scopeId = aVar9.scopeId;
  compileValueInner(&result,this,src,type);
  if (ANY_POINTER < result.type) goto switchD_00183b17_default;
  uVar10 = uVar4 >> 0x20;
  switch(result.type) {
  case UNKNOWN:
    goto switchD_00183814_caseD_0;
  case VOID:
    bVar2 = WVar8 == VOID;
    goto LAB_0018398f;
  case BOOL:
    bVar2 = WVar8 == BOOL;
    goto LAB_0018398f;
  case INT:
    Orphan<capnp::DynamicValue>::getReader((Reader *)&f,&result);
    uVar4 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply((Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&f);
    if (-1 < (long)uVar4) {
      uVar4 = (ulong)type_local.baseType;
      uVar1 = type_local.listDepth;
      goto switchD_00183814_caseD_4;
    }
    WVar8 = LIST;
    if (type_local.listDepth == '\0') {
      WVar8 = type_local.baseType;
    }
    switch(WVar8) {
    case INT8:
      uVar10 = 0xffffffffffffff80;
      break;
    case INT16:
      uVar10 = 0xffffffffffff8000;
      break;
    case INT32:
      uVar10 = 0xffffffff80000000;
      break;
    case INT64:
    case FLOAT32:
    case FLOAT64:
      goto switchD_00183b17_caseD_5;
    case UINT8:
    case UINT16:
    case UINT32:
    case UINT64:
      goto LAB_00183be5;
    default:
      goto switchD_00183b17_default;
    }
    if (uVar4 < uVar10) {
LAB_00183be5:
      message_01.content.size_ = 0x1c;
      message_01.content.ptr = "Integer value out of range.";
      ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                (this->errorReporter,&src,message_01);
      f.exception._0_4_ = 3;
      local_108._16_8_ = (SegmentReader *)0x0;
      local_108._24_8_ = (CapTableReader *)0x0;
      local_108._32_8_ = (byte *)0x0;
      local_108._40_8_ = 0;
      Orphan<capnp::DynamicValue>::operator=(&result,(Orphan<capnp::DynamicValue> *)&f);
      _::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)(local_108 + 0x10));
    }
    goto switchD_00183b17_caseD_5;
  case UINT:
switchD_00183814_caseD_4:
    uVar3 = 0xc;
    if (uVar1 == '\0') {
      uVar3 = (short)uVar4 - 2;
    }
    if (9 < uVar3) break;
    uVar4 = *(ulong *)(&DAT_001da3a0 + (ulong)uVar3 * 8);
    Orphan<capnp::DynamicValue>::getReader((Reader *)&f,&result);
    uVar5 = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply((Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&f);
    if (uVar4 < uVar5) {
      message.content.size_ = 0x1c;
      message.content.ptr = "Integer value out of range.";
      ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                (this->errorReporter,&src,message);
      f.exception._0_4_ = 4;
      local_108._16_8_ = (SegmentReader *)0x0;
      local_108._24_8_ = (CapTableReader *)0x0;
      local_108._32_8_ = (byte *)0x0;
      local_108._40_8_ = 0;
      Orphan<capnp::DynamicValue>::operator=(&result,(Orphan<capnp::DynamicValue> *)&f);
      _::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)(local_108 + 0x10));
    }
    goto switchD_00183b17_caseD_5;
  case FLOAT:
    if ((WVar8 & ~BOOL) == FLOAT32 && uVar1 == '\0') goto switchD_00183b17_caseD_5;
    break;
  case TEXT:
    bVar2 = WVar8 == TEXT;
    goto LAB_0018398f;
  case DATA:
    bVar2 = WVar8 == DATA;
LAB_0018398f:
    if ((bool)(uVar1 == '\0' & bVar2)) {
switchD_00183b17_caseD_5:
      kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::NullableValue
                (&__return_storage_ptr__->ptr,&result);
      goto LAB_00183ba4;
    }
    break;
  case LIST:
    if (uVar1 == '\0') {
      if (WVar8 == ANY_POINTER) {
        if (aVar9.schema != (RawBrandedSchema *)0x0) {
          uVar10 = 0;
        }
        if ((uVar4 >> 0x18 & 1) != 0) {
          uVar10 = 0;
        }
        if ((uVar10 & 0xfffd) == 0) goto switchD_00183b17_caseD_5;
      }
    }
    else {
      Orphan<capnp::DynamicValue>::getReader((Reader *)&f,&result);
      DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicList> *)&local_90,(Reader *)&f);
      local_50 = local_90.raw;
      aStack_48 = aStack_88;
      local_40 = (Type)Type::asList(&type_local);
      bVar2 = Type::operator==((Type *)&local_50,&local_40);
      DynamicValue::Reader::~Reader((Reader *)&f);
      if (bVar2) goto switchD_00183b17_caseD_5;
    }
    break;
  case ENUM:
    if (uVar1 == '\0' && WVar8 == ENUM) {
      Orphan<capnp::DynamicValue>::getReader((Reader *)&f,&result);
      RVar12 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply((Reader *)&f)
      ;
      EVar6 = Type::asEnum(&type_local);
      DynamicValue::Reader::~Reader((Reader *)&f);
      if ((RawBrandedSchema *)RVar12.schema.super_Schema.raw == EVar6.super_Schema.raw)
      goto switchD_00183b17_caseD_5;
    }
    break;
  case STRUCT:
    if (uVar1 == '\0' && WVar8 == STRUCT) {
      Orphan<capnp::DynamicValue>::getReader((Reader *)&f,&result);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicStruct> *)&local_90,(Reader *)&f);
      SVar7 = Type::asStruct(&type_local);
      DynamicValue::Reader::~Reader((Reader *)&f);
      if ((Schema)local_90.raw != SVar7.super_Schema.raw) break;
      goto switchD_00183b17_caseD_5;
    }
    if ((WVar8 == ANY_POINTER && uVar1 == '\0') &&
       (type.field_3.paramIndex < 2 ||
        (aVar9.schema != (RawBrandedSchema *)0x0 ||
        ((undefined1  [16])type & (undefined1  [16])0x1000000) != (undefined1  [16])0x0)))
    goto switchD_00183b17_caseD_5;
    break;
  case CAPABILITY:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0xb14,FAILED,(char *)0x0,"\"Interfaces can\'t have literal values.\"",
               (char (*) [38])"Interfaces can\'t have literal values.");
    kj::_::Debug::Fault::fatal(&f);
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0xb17,FAILED,(char *)0x0,"\"AnyPointers can\'t have literal values.\"",
               (char (*) [39])"AnyPointers can\'t have literal values.");
    kj::_::Debug::Fault::fatal(&f);
  }
switchD_00183b17_default:
  this_00 = this->errorReporter;
  type_00.listDepth = type_local.listDepth;
  type_00.baseType = type_local.baseType;
  type_00.isImplicitParam = type_local.isImplicitParam;
  type_00.field_3 = type_local.field_3;
  type_00._6_2_ = type_local._6_2_;
  type_00.field_4.schema = type_local.field_4.schema;
  makeTypeName((String *)&local_90,this,type_00);
  kj::str<char_const(&)[25],kj::String,char_const(&)[2]>
            ((String *)&f,(kj *)"Type mismatch; expected ",(char (*) [25])&local_90,
             (String *)0x1db34d,in_R8);
  if (local_108._0_8_ == 0) {
    pcVar11 = "";
  }
  else {
    pcVar11 = (char *)CONCAT44(f.exception._4_4_,f.exception._0_4_);
  }
  message_00.content.size_ = (char *)(local_108._0_8_ + (ulong)(local_108._0_8_ == 0));
  message_00.content.ptr = pcVar11;
  ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>(this_00,&src,message_00);
  kj::Array<char>::~Array((Array<char> *)&f);
  kj::Array<char>::~Array((Array<char> *)&local_90);
switchD_00183814_caseD_0:
  (__return_storage_ptr__->ptr).isSet = false;
LAB_00183ba4:
  _::OrphanBuilder::~OrphanBuilder(&result.builder);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Orphan<DynamicValue>> ValueTranslator::compileValue(Expression::Reader src, Type type) {
  Orphan<DynamicValue> result = compileValueInner(src, type);

  switch (result.getType()) {
    case DynamicValue::UNKNOWN:
      // Error already reported.
      return nullptr;

    case DynamicValue::VOID:
      if (type.isVoid()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::BOOL:
      if (type.isBool()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::INT: {
      int64_t value = result.getReader().as<int64_t>();
      if (value < 0) {
        int64_t minValue = 1;
        switch (type.which()) {
          case schema::Type::INT8: minValue = (int8_t)kj::minValue; break;
          case schema::Type::INT16: minValue = (int16_t)kj::minValue; break;
          case schema::Type::INT32: minValue = (int32_t)kj::minValue; break;
          case schema::Type::INT64: minValue = (int64_t)kj::minValue; break;
          case schema::Type::UINT8: minValue = (uint8_t)kj::minValue; break;
          case schema::Type::UINT16: minValue = (uint16_t)kj::minValue; break;
          case schema::Type::UINT32: minValue = (uint32_t)kj::minValue; break;
          case schema::Type::UINT64: minValue = (uint64_t)kj::minValue; break;

          case schema::Type::FLOAT32:
          case schema::Type::FLOAT64:
            // Any integer is acceptable.
            minValue = (int64_t)kj::minValue;
            break;

          default: break;
        }
        if (minValue == 1) break;

        if (value < minValue) {
          errorReporter.addErrorOn(src, "Integer value out of range.");
          result = minValue;
        }
        return kj::mv(result);
      }

    } // fallthrough -- value is positive, so we can just go on to the uint case below.

    case DynamicValue::UINT: {
      uint64_t maxValue = 0;
      switch (type.which()) {
        case schema::Type::INT8: maxValue = (int8_t)kj::maxValue; break;
        case schema::Type::INT16: maxValue = (int16_t)kj::maxValue; break;
        case schema::Type::INT32: maxValue = (int32_t)kj::maxValue; break;
        case schema::Type::INT64: maxValue = (int64_t)kj::maxValue; break;
        case schema::Type::UINT8: maxValue = (uint8_t)kj::maxValue; break;
        case schema::Type::UINT16: maxValue = (uint16_t)kj::maxValue; break;
        case schema::Type::UINT32: maxValue = (uint32_t)kj::maxValue; break;
        case schema::Type::UINT64: maxValue = (uint64_t)kj::maxValue; break;

        case schema::Type::FLOAT32:
        case schema::Type::FLOAT64:
          // Any integer is acceptable.
          maxValue = (uint64_t)kj::maxValue;
          break;

        default: break;
      }
      if (maxValue == 0) break;

      if (result.getReader().as<uint64_t>() > maxValue) {
        errorReporter.addErrorOn(src, "Integer value out of range.");
        result = maxValue;
      }
      return kj::mv(result);
    }

    case DynamicValue::FLOAT:
      if (type.isFloat32() || type.isFloat64()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::TEXT:
      if (type.isText()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::DATA:
      if (type.isData()) {
        return kj::mv(result);
      }
      break;

    case DynamicValue::LIST:
      if (type.isList()) {
        if (result.getReader().as<DynamicList>().getSchema() == type.asList()) {
          return kj::mv(result);
        }
      } else if (type.isAnyPointer()) {
        switch (type.whichAnyPointerKind()) {
          case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
          case schema::Type::AnyPointer::Unconstrained::LIST:
            return kj::mv(result);
          case schema::Type::AnyPointer::Unconstrained::STRUCT:
          case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
            break;
        }
      }
      break;

    case DynamicValue::ENUM:
      if (type.isEnum()) {
        if (result.getReader().as<DynamicEnum>().getSchema() == type.asEnum()) {
          return kj::mv(result);
        }
      }
      break;

    case DynamicValue::STRUCT:
      if (type.isStruct()) {
        if (result.getReader().as<DynamicStruct>().getSchema() == type.asStruct()) {
          return kj::mv(result);
        }
      } else if (type.isAnyPointer()) {
        switch (type.whichAnyPointerKind()) {
          case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
          case schema::Type::AnyPointer::Unconstrained::STRUCT:
            return kj::mv(result);
          case schema::Type::AnyPointer::Unconstrained::LIST:
          case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
            break;
        }
      }
      break;

    case DynamicValue::CAPABILITY:
      KJ_FAIL_ASSERT("Interfaces can't have literal values.");

    case DynamicValue::ANY_POINTER:
      KJ_FAIL_ASSERT("AnyPointers can't have literal values.");
  }

  errorReporter.addErrorOn(src, kj::str("Type mismatch; expected ", makeTypeName(type), "."));
  return nullptr;
}